

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O0

void google::protobuf::Type::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Type *pTVar2;
  string *psVar3;
  bool bVar4;
  Syntax SVar5;
  Type **v1;
  Type **v2;
  char *failure_msg;
  LogMessage *pLVar6;
  RepeatedPtrField<google::protobuf::Field> *this;
  RepeatedPtrField<google::protobuf::Field> *other;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other_00;
  RepeatedPtrField<google::protobuf::Option> *this_01;
  RepeatedPtrField<google::protobuf::Option> *other_01;
  uint32_t *puVar7;
  ulong uVar8;
  Arena *pAVar9;
  SourceContext *pSVar10;
  LogMessage local_138;
  Voidify local_122;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  uint local_d8;
  uint32_t cached_has_bits;
  LogMessage local_c8;
  Voidify local_b1;
  Type *local_b0;
  Nullable<const_char_*> local_a8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  Type *from;
  Type *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_70;
  string *local_68;
  Type *local_60;
  anon_union_112_1_493b367e_for_Type_3 *local_58;
  string *local_50;
  Type *local_48;
  anon_union_112_1_493b367e_for_Type_3 *local_40;
  string *local_38;
  Type *local_30;
  anon_union_112_1_493b367e_for_Type_3 *local_28;
  string *local_20;
  Type *local_18;
  anon_union_112_1_493b367e_for_Type_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (Type *)to_msg;
  _this = (Type *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)protobuf::MessageLite::GetArena(to_msg);
  local_b0 = (Type *)arena;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Type_const*>
                 (&local_b0);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Type*>(&from);
  local_a8 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::Type_const*,google::protobuf::Type*>
                       (v1,v2,"&from != _this");
  if (local_a8 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_a8);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
               ,0x32a,failure_msg);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_b1,pLVar6);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c8);
  }
  local_d8 = 0;
  this = _internal_mutable_fields(from);
  other = _internal_fields((Type *)arena);
  RepeatedPtrField<google::protobuf::Field>::MergeFrom(this,other);
  this_00 = _internal_mutable_oneofs_abi_cxx11_(from);
  other_00 = _internal_oneofs_abi_cxx11_((Type *)arena);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this_00,other_00);
  this_01 = _internal_mutable_options(from);
  other_01 = _internal_options((Type *)arena);
  RepeatedPtrField<google::protobuf::Option>::MergeFrom(this_01,other_01);
  puVar7 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_d8 = *puVar7;
  if ((local_d8 & 0xf) != 0) {
    if ((local_d8 & 1) != 0) {
      _internal_name_abi_cxx11_((Type *)arena);
      uVar8 = std::__cxx11::string::empty();
      pTVar2 = from;
      if ((uVar8 & 1) == 0) {
        local_50 = _internal_name_abi_cxx11_((Type *)arena);
        local_48 = pTVar2;
        local_40 = &pTVar2->field_0;
        puVar7 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
        psVar3 = local_50;
        *puVar7 = *puVar7 | 1;
        pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        internal::ArenaStringPtr::Set<>(&(pTVar2->field_0)._impl_.name_,psVar3,pAVar9);
      }
      else {
        bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.name_);
        pTVar2 = from;
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,anon_var_dwarf_37cdd0 + 5,&local_f9);
          local_60 = pTVar2;
          local_68 = &local_f8;
          local_58 = &pTVar2->field_0;
          puVar7 = internal::HasBits<1>::operator[](&(local_58->_impl_)._has_bits_,0);
          psVar3 = local_68;
          *(byte *)puVar7 = (byte)*puVar7 | 1;
          pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
          internal::ArenaStringPtr::Set<>(&(pTVar2->field_0)._impl_.name_,psVar3,pAVar9);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator(&local_f9);
        }
      }
    }
    if ((local_d8 & 2) != 0) {
      _internal_edition_abi_cxx11_((Type *)arena);
      uVar8 = std::__cxx11::string::empty();
      pTVar2 = from;
      if ((uVar8 & 1) == 0) {
        local_20 = _internal_edition_abi_cxx11_((Type *)arena);
        local_18 = pTVar2;
        local_10 = &pTVar2->field_0;
        puVar7 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
        psVar3 = local_20;
        *puVar7 = *puVar7 | 2;
        pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        internal::ArenaStringPtr::Set<>(&(pTVar2->field_0)._impl_.edition_,psVar3,pAVar9);
      }
      else {
        bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.edition_);
        pTVar2 = from;
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,anon_var_dwarf_37cdd0 + 5,&local_121);
          local_30 = pTVar2;
          local_38 = &local_120;
          local_28 = &pTVar2->field_0;
          puVar7 = internal::HasBits<1>::operator[](&(local_28->_impl_)._has_bits_,0);
          psVar3 = local_38;
          *(byte *)puVar7 = (byte)*puVar7 | 2;
          pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
          internal::ArenaStringPtr::Set<>(&(pTVar2->field_0)._impl_.edition_,psVar3,pAVar9);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
        }
      }
    }
    if ((local_d8 & 4) != 0) {
      if ((arena->impl_).first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i
          == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
                   ,0x348,"from._impl_.source_context_ != nullptr");
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_138);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_122,pLVar6);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_138);
      }
      if ((from->field_0)._impl_.source_context_ == (SourceContext *)0x0) {
        to_msg_local = (MessageLite *)
                       (arena->impl_).first_arena_.string_block_unused_.
                       super___atomic_base<unsigned_long>._M_i;
        local_70 = absl_log_internal_check_op_result;
        pSVar10 = (SourceContext *)
                  Arena::CopyConstruct<google::protobuf::SourceContext>
                            ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.source_context_ = pSVar10;
      }
      else {
        SourceContext::MergeFrom
                  ((from->field_0)._impl_.source_context_,
                   (SourceContext *)
                   (arena->impl_).first_arena_.string_block_unused_.
                   super___atomic_base<unsigned_long>._M_i);
      }
    }
    if (((local_d8 & 8) != 0) && (SVar5 = _internal_syntax((Type *)arena), SVar5 != SYNTAX_PROTO2))
    {
      (from->field_0)._impl_.syntax_ = *(int *)&(arena->impl_).first_arena_.head_._M_b._M_p;
    }
  }
  uVar1 = local_d8;
  puVar7 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar7 = uVar1 | *puVar7;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void Type::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Type*>(&to_msg);
  auto& from = static_cast<const Type&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Type)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_fields()->MergeFrom(
      from._internal_fields());
  _this->_internal_mutable_oneofs()->MergeFrom(from._internal_oneofs());
  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_edition().empty()) {
        _this->_internal_set_edition(from._internal_edition());
      } else {
        if (_this->_impl_.edition_.IsDefault()) {
          _this->_internal_set_edition("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.source_context_ != nullptr);
      if (_this->_impl_.source_context_ == nullptr) {
        _this->_impl_.source_context_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.source_context_);
      } else {
        _this->_impl_.source_context_->MergeFrom(*from._impl_.source_context_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_syntax() != 0) {
        _this->_impl_.syntax_ = from._impl_.syntax_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}